

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intFrames.c
# Opt level: O2

Aig_Man_t * Inter_ManFramesInter(Aig_Man_t *pAig,int nFrames,int fAddRegOuts,int fUseTwoFrames)

{
  int iVar1;
  Aig_Man_t *p;
  void *pvVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  void *pvVar5;
  ulong uVar6;
  Aig_Obj_t *pAVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  char *__assertion;
  int iVar11;
  Aig_Obj_t *local_38;
  
  pAVar4 = (Aig_Obj_t *)(ulong)(uint)nFrames;
  if (pAig->nRegs < 1) {
    __assertion = "Saig_ManRegNum(pAig) > 0";
    uVar10 = 0x35;
  }
  else {
    if (pAig->nTruePos - pAig->nConstrs == 1) {
      p = Aig_ManStart((pAig->nObjs[6] + pAig->nObjs[5]) * nFrames);
      pAig->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p->pConst1;
      if (fAddRegOuts == 0) {
        for (iVar8 = 0; iVar8 < pAig->nRegs; iVar8 = iVar8 + 1) {
          uVar10 = pAig->nTruePis + iVar8;
          pAVar4 = (Aig_Obj_t *)(ulong)uVar10;
          pvVar2 = Vec_PtrEntry(pAig->vCis,uVar10);
          pAVar3 = Aig_ObjCreateCi(p);
          *(Aig_Obj_t **)((long)pvVar2 + 0x28) = pAVar3;
        }
      }
      else {
        for (iVar8 = 0; iVar8 < pAig->nRegs; iVar8 = iVar8 + 1) {
          uVar10 = pAig->nTruePis + iVar8;
          pAVar4 = (Aig_Obj_t *)(ulong)uVar10;
          pvVar2 = Vec_PtrEntry(pAig->vCis,uVar10);
          *(ulong *)((long)pvVar2 + 0x28) = (ulong)p->pConst1 ^ 1;
        }
      }
      iVar8 = nFrames + -1;
      local_38 = (Aig_Obj_t *)0x0;
      if (nFrames < 1) {
        nFrames = 0;
      }
      for (iVar11 = 0; iVar9 = (int)pAVar4, iVar11 != nFrames; iVar11 = iVar11 + 1) {
        for (uVar10 = 0; (int)uVar10 < pAig->nTruePis; uVar10 = uVar10 + 1) {
          pAVar4 = (Aig_Obj_t *)(ulong)uVar10;
          pvVar2 = Vec_PtrEntry(pAig->vCis,uVar10);
          pAVar3 = Aig_ObjCreateCi(p);
          *(Aig_Obj_t **)((long)pvVar2 + 0x28) = pAVar3;
        }
        for (uVar10 = 0; (int)uVar10 < pAig->vObjs->nSize; uVar10 = uVar10 + 1) {
          pAVar4 = (Aig_Obj_t *)(ulong)uVar10;
          pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,uVar10);
          if ((pAVar3 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar3->field_0x18 & 7) - 7))
          {
            pAVar4 = Aig_ObjChild0Copy(pAVar3);
            if (((ulong)pAVar3 & 1) != 0) {
              __assert_fail("!Aig_IsComplement(pObj)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                            ,0x139,"Aig_Obj_t *Aig_ObjChild1Copy(Aig_Obj_t *)");
            }
            uVar6 = (ulong)pAVar3->pFanin1 & 0xfffffffffffffffe;
            if (uVar6 == 0) {
              pAVar7 = (Aig_Obj_t *)0x0;
            }
            else {
              pAVar7 = (Aig_Obj_t *)((ulong)((uint)pAVar3->pFanin1 & 1) ^ *(ulong *)(uVar6 + 0x28));
            }
            pAVar7 = Aig_And(p,pAVar4,pAVar7);
            (pAVar3->field_5).pData = pAVar7;
          }
        }
        for (uVar10 = 0; iVar9 = (int)pAVar4, (int)uVar10 < pAig->nTruePos; uVar10 = uVar10 + 1) {
          pAVar4 = (Aig_Obj_t *)(ulong)uVar10;
          pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,uVar10);
          if (pAig->nTruePos - pAig->nConstrs <= (int)uVar10) {
            pAVar4 = Aig_ObjChild0Copy(pAVar3);
            pAVar4 = (Aig_Obj_t *)((ulong)pAVar4 ^ 1);
            Aig_ObjCreateCo(p,pAVar4);
          }
        }
        if (iVar11 == iVar8) break;
        pAVar3 = Aig_ManCo(pAig,iVar9);
        local_38 = Aig_ObjChild0Copy(pAVar3);
        for (iVar9 = 0; iVar1 = pAig->nRegs, iVar9 < iVar1; iVar9 = iVar9 + 1) {
          uVar10 = pAig->nTruePos + iVar9;
          pAVar4 = (Aig_Obj_t *)(ulong)uVar10;
          pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,uVar10);
          pAVar7 = Aig_ObjChild0Copy(pAVar3);
          (pAVar3->field_5).pData = pAVar7;
        }
        for (iVar9 = 0; iVar9 < iVar1; iVar9 = iVar9 + 1) {
          pvVar2 = Vec_PtrEntry(pAig->vCos,pAig->nTruePos + iVar9);
          uVar10 = pAig->nTruePis + iVar9;
          pAVar4 = (Aig_Obj_t *)(ulong)uVar10;
          pvVar5 = Vec_PtrEntry(pAig->vCis,uVar10);
          *(undefined8 *)((long)pvVar5 + 0x28) = *(undefined8 *)((long)pvVar2 + 0x28);
          iVar1 = pAig->nRegs;
        }
      }
      if (fAddRegOuts == 0) {
        pAVar4 = Aig_ManCo(pAig,iVar9);
        pAVar4 = Aig_ObjChild0Copy(pAVar4);
        if (fUseTwoFrames != 0 && local_38 != (Aig_Obj_t *)0x0) {
          pAVar4 = Aig_Or(p,local_38,pAVar4);
        }
        Aig_ObjCreateCo(p,pAVar4);
      }
      else {
        for (iVar8 = 0; iVar8 < pAig->nRegs; iVar8 = iVar8 + 1) {
          pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,pAig->nTruePos + iVar8);
          pAVar4 = Aig_ObjChild0Copy(pAVar4);
          Aig_ObjCreateCo(p,pAVar4);
        }
      }
      Aig_ManCleanup(p);
      return p;
    }
    __assertion = "Saig_ManPoNum(pAig)-Saig_ManConstrNum(pAig) == 1";
    uVar10 = 0x36;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/int/intFrames.c"
                ,uVar10,"Aig_Man_t *Inter_ManFramesInter(Aig_Man_t *, int, int, int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Create timeframes of the manager for interpolation.]

  Description [The resulting manager is combinational. The primary inputs
  corresponding to register outputs are ordered first. The only POs of the 
  manager is the property output of the last timeframe.]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Aig_Man_t * Inter_ManFramesInter( Aig_Man_t * pAig, int nFrames, int fAddRegOuts, int fUseTwoFrames )
{
    Aig_Man_t * pFrames;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo;
    Aig_Obj_t * pLastPo = NULL;
    int i, f;
    assert( Saig_ManRegNum(pAig) > 0 );
    assert( Saig_ManPoNum(pAig)-Saig_ManConstrNum(pAig) == 1 );
    pFrames = Aig_ManStart( Aig_ManNodeNum(pAig) * nFrames );
    // map the constant node
    Aig_ManConst1(pAig)->pData = Aig_ManConst1( pFrames );
    // create variables for register outputs
    if ( fAddRegOuts )
    {
        Saig_ManForEachLo( pAig, pObj, i )
            pObj->pData = Aig_ManConst0( pFrames );
    }
    else
    {
        Saig_ManForEachLo( pAig, pObj, i )
            pObj->pData = Aig_ObjCreateCi( pFrames );
    }
    // add timeframes
    for ( f = 0; f < nFrames; f++ )
    {
        // create PI nodes for this frame
        Saig_ManForEachPi( pAig, pObj, i )
            pObj->pData = Aig_ObjCreateCi( pFrames );
        // add internal nodes of this frame
        Aig_ManForEachNode( pAig, pObj, i )
            pObj->pData = Aig_And( pFrames, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
        // add outputs for constraints
        Saig_ManForEachPo( pAig, pObj, i )
        {
            if ( i < Saig_ManPoNum(pAig)-Saig_ManConstrNum(pAig) )
                continue;
            Aig_ObjCreateCo( pFrames, Aig_Not( Aig_ObjChild0Copy(pObj) ) );
        }
        if ( f == nFrames - 1 )
            break;
        // remember the last PO
        pObj = Aig_ManCo( pAig, 0 );
        pLastPo = Aig_ObjChild0Copy(pObj);
        // save register inputs
        Saig_ManForEachLi( pAig, pObj, i )
            pObj->pData = Aig_ObjChild0Copy(pObj);
        // transfer to register outputs
        Saig_ManForEachLiLo(  pAig, pObjLi, pObjLo, i )
            pObjLo->pData = pObjLi->pData;
    }
    // create POs for each register output
    if ( fAddRegOuts )
    {
        Saig_ManForEachLi( pAig, pObj, i )
            Aig_ObjCreateCo( pFrames, Aig_ObjChild0Copy(pObj) );
    }
    // create the only PO of the manager
    else
    {
        pObj = Aig_ManCo( pAig, 0 );
        // add the last PO
        if ( pLastPo == NULL || !fUseTwoFrames )
            pLastPo = Aig_ObjChild0Copy(pObj);
        else
            pLastPo = Aig_Or( pFrames, pLastPo, Aig_ObjChild0Copy(pObj) );
        Aig_ObjCreateCo( pFrames, pLastPo );
    }
    Aig_ManCleanup( pFrames );
    return pFrames;
}